

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

bool __thiscall
iutest::detail::TypedTestSuitePState::VerifyTestNames
          (TypedTestSuitePState *this,char *file,int line,char *test_names)

{
  char *__needle;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  int iVar6;
  bool bVar7;
  char local_1f5;
  uint local_1f4;
  string local_1f0;
  detail *local_1d0;
  _Rb_tree_node_base *local_1c8;
  undefined1 local_1c0 [400];
  
  this->m_names = test_names;
  p_Var5 = (this->m_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c8 = &(this->m_list)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 == local_1c8) {
    bVar7 = true;
  }
  else {
    bVar7 = true;
    local_1f4 = line;
    local_1d0 = (detail *)file;
    do {
      __needle = *(char **)(p_Var5 + 1);
      pcVar1 = strstr(test_names,__needle);
      if (pcVar1 == (char *)0x0) {
LAB_00113bfe:
        iVar6 = 0x1c8;
        IUTestLog::IUTestLog
                  ((IUTestLog *)local_1c0,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
                   ,0x1c8);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_1f0,local_1d0,(char *)(ulong)local_1f4,iVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_1c0 + 0x18),local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Test \"",8);
        if (__needle == (char *)0x0) {
          std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
        }
        else {
          sVar2 = strlen(__needle);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,__needle,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"\" has not been registered.\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    TestNames: ",0xf);
        if (test_names == (char *)0x0) {
          std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
        }
        else {
          sVar2 = strlen(test_names);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,test_names,sVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
        bVar7 = false;
      }
      else {
        sVar2 = strlen(__needle);
        if ((0x2c < (ulong)(byte)pcVar1[sVar2]) ||
           ((0x100100000201U >> ((ulong)(byte)pcVar1[sVar2] & 0x3f) & 1) == 0)) {
          iVar6 = 0x1c4;
          IUTestLog::IUTestLog
                    ((IUTestLog *)local_1c0,LOG_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
                     ,0x1c4);
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_1f0,local_1d0,(char *)(ulong)local_1f4,iVar6);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)(local_1c0 + 0x18),local_1f0._M_dataplus._M_p,
                              local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Test \"",8);
          if (__needle == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(__needle);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,__needle,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" is find in \"",0xe);
          if (test_names == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(test_names);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,test_names,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"\". expected whitespace or comma : ",0x22);
          local_1f5 = pcVar1[sVar2];
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1f5,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)pcVar1[sVar2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
          goto LAB_00113bfe;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_1c8);
  }
  return bVar7;
}

Assistant:

bool VerifyTestNames(const char* file, int line, const char* test_names)
    {
        m_names = test_names;
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
#if IUTEST_TYPED_TEST_P_STRICT
        bool ret = true;
        for( nameset_t::iterator it=m_list.begin(), end=m_list.end(); it != end; ++it )
        {
            const char* test_name = *it;
            const char* p = strstr(test_names, test_name);
            if( p != NULL )
            {
                const size_t len = strlen(test_name);
                if( p[len] == '\0' || p[len] == ',' || detail::IsSpace(p[len]) )
                {
                    continue;
                }
                IUTEST_LOG_(FATAL) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" is find in \"" << test_names
                    << "\". expected whitespace or comma : " << p[len] << "(" << static_cast<int>(p[len]) <<  ")\n";
            }
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" has not been registered.\n" << "    TestNames: " << test_names;
            ret = false;
        }
        return ret;
#else
        IUTEST_UNUSED_VAR(file);
        IUTEST_UNUSED_VAR(line);
        return true;
#endif
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
    }